

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_initialize(REF_GEOM ref_geom)

{
  REF_INT *pRVar1;
  uint uVar2;
  int iVar3;
  REF_INT *pRVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  
  ref_geom->n = 0;
  iVar3 = ref_geom->max;
  pRVar1 = ref_geom->descr;
  if (0 < iVar3) {
    pRVar4 = pRVar1 + 1;
    lVar6 = 0;
    do {
      pRVar4[-1] = -1;
      lVar6 = lVar6 + 1;
      *pRVar4 = (REF_INT)lVar6;
      iVar3 = ref_geom->max;
      pRVar4 = pRVar4 + 6;
    } while (lVar6 < iVar3);
  }
  pRVar1[iVar3 * 6 + -5] = -1;
  ref_geom->blank = 0;
  if ((ref_geom->ref_adj == (REF_ADJ)0x0) || (uVar2 = ref_adj_free(ref_geom->ref_adj), uVar2 == 0))
  {
    uVar2 = ref_adj_create(&ref_geom->ref_adj);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar7 = "create ref_adj for ref_geom";
    uVar5 = 0x36;
  }
  else {
    pcVar7 = "free to prevent leak";
    uVar5 = 0x35;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
         "ref_geom_initialize",(ulong)uVar2,pcVar7);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_initialize(REF_GEOM ref_geom) {
  REF_INT geom;
  ref_geom_n(ref_geom) = 0;
  for (geom = 0; geom < ref_geom_max(ref_geom); geom++) {
    ref_geom_type(ref_geom, geom) = REF_EMPTY;
    ref_geom_id(ref_geom, geom) = geom + 1;
  }
  ref_geom_id(ref_geom, ref_geom_max(ref_geom) - 1) = REF_EMPTY;
  ref_geom_blank(ref_geom) = 0;
  if (NULL != (void *)(ref_geom->ref_adj))
    RSS(ref_adj_free(ref_geom->ref_adj), "free to prevent leak");
  RSS(ref_adj_create(&(ref_geom->ref_adj)), "create ref_adj for ref_geom");

  return REF_SUCCESS;
}